

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,ForStmt *node)

{
  shared_ptr<mocker::ast::Expression> *__r;
  bool bVar1;
  mapped_type *rhs;
  CompileError *this_00;
  mapped_type *pmVar2;
  ScopeID scopeIntroduced;
  shared_ptr<mocker::ast::ASTNode> local_a0;
  __shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  if ((node->init).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Expression,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&scopeIntroduced,
               &(node->init).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
              );
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
               &(this->scopeResiding).ids);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)&scopeIntroduced,(ScopeID *)&local_38);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &scopeIntroduced.ids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  if ((node->condition).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    __r = &node->condition;
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Expression,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&scopeIntroduced,
               &__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,
               &(this->scopeResiding).ids);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)&scopeIntroduced,(ScopeID *)&local_50);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &scopeIntroduced.ids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::BuiltinType,void>
              ((__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2> *)&scopeIntroduced,
               &(this->builtinBool).
                super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>);
    local_a0.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_ASTNode;
    rhs = std::__detail::
          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this->ctx->exprType,(key_type *)&local_a0);
    bVar1 = assignable(this,(shared_ptr<mocker::ast::Type> *)&scopeIntroduced,rhs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &scopeIntroduced.ids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
    if (!bVar1) {
      this_00 = (CompileError *)__cxa_allocate_exception(0x48);
      scopeIntroduced.ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
      pmVar2 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this->pos,(key_type *)&scopeIntroduced);
      CompileError::CompileError(this_00,pmVar2->first,pmVar2->second);
      *(undefined ***)this_00 = &PTR__CompileError_001f39f8;
      __cxa_throw(this_00,&IncompatibleTypes::typeinfo,CompileError::~CompileError);
    }
  }
  if ((node->update).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Expression,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&scopeIntroduced,
               &(node->update).
                super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               &(this->scopeResiding).ids);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)&scopeIntroduced,(ScopeID *)&local_68);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &scopeIntroduced.ids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  SymTbl::createSubscope(&scopeIntroduced,&this->ctx->syms,&this->scopeResiding);
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::Statement,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             &(node->body).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,&scopeIntroduced.ids
            );
  bVar1 = this->inFunc;
  std::__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             &(this->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>);
  visit(this,&local_a0,(ScopeID *)&local_80,true,bVar1,(shared_ptr<mocker::ast::Type> *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&scopeIntroduced);
  return;
}

Assistant:

void operator()(ast::ForStmt &node) const override {
    if (node.init)
      visit(node.init, scopeResiding);
    if (node.condition) {
      visit(node.condition, scopeResiding);
      if (!assignable(builtinBool, ctx.exprType[node.condition->getID()]))
        throw IncompatibleTypes(pos.at(node.condition->getID()));
    }
    if (node.update)
      visit(node.update, scopeResiding);

    auto scopeIntroduced = ctx.syms.createSubscope(scopeResiding);
    visit(node.body, scopeIntroduced, true, inFunc, retType);
  }